

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Bech32.cpp
# Opt level: O0

void __thiscall
Bech32Test_verifyChecksum_bad_Test::~Bech32Test_verifyChecksum_bad_Test
          (Bech32Test_verifyChecksum_bad_Test *this)

{
  Bech32Test_verifyChecksum_bad_Test *this_local;
  
  ~Bech32Test_verifyChecksum_bad_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Bech32Test, verifyChecksum_bad) {
    std::string str("a1lqfn33");
    std::string hrp = extractHumanReadablePart(str);
    std::vector<unsigned char> dp = extractDataPart(str);
    convertToLowercase(hrp);
    mapDP(dp);
    ASSERT_FALSE(verifyChecksum(hrp, dp));

    str = "A1LQFN33";
    hrp = extractHumanReadablePart(str);
    dp = extractDataPart(str);
    convertToLowercase(hrp);
    mapDP(dp);
    ASSERT_FALSE(verifyChecksum(hrp, dp));

    str = "abcdef1l7aum6echk45nj3s0wdvt2fg8x9yrzpqzd3ryy";
    hrp = extractHumanReadablePart(str);
    dp = extractDataPart(str);
    convertToLowercase(hrp);
    mapDP(dp);
    ASSERT_FALSE(verifyChecksum(hrp, dp));

    str = "split1checkupstagehandshakeupstreamerranterredcaperredlc445s";
    hrp = extractHumanReadablePart(str);
    dp = extractDataPart(str);
    convertToLowercase(hrp);
    mapDP(dp);
    ASSERT_FALSE(verifyChecksum(hrp, dp));

    str = "an83characterlonghumanreadablepartthatcontainsthetheexcludedcharactersbioandnumber11sg7hg7";
    hrp = extractHumanReadablePart(str);
    dp = extractDataPart(str);
    convertToLowercase(hrp);
    mapDP(dp);
    ASSERT_FALSE(verifyChecksum(hrp, dp));

    str = "11llllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllludsrc";
    hrp = extractHumanReadablePart(str);
    dp = extractDataPart(str);
    convertToLowercase(hrp);
    mapDP(dp);
    ASSERT_FALSE(verifyChecksum(hrp, dp));
}